

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

QListWidgetItem * __thiscall QListWidget::itemAt(QListWidget *this,QPoint *p)

{
  long lVar1;
  QListWidgetItem *pQVar2;
  long in_FS_OFFSET;
  int local_40 [6];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = QMetaObject::cast((QObject *)&QListModel::staticMetaObject);
  (**(code **)(*(long *)&(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea.
                         super_QFrame.super_QWidget + 0x1f0))(local_40,this,p);
  if ((ulong)(long)local_40[0] < *(ulong *)(lVar1 + 0x20)) {
    pQVar2 = *(QListWidgetItem **)(*(long *)(lVar1 + 0x18) + (long)local_40[0] * 8);
  }
  else {
    pQVar2 = (QListWidgetItem *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QListWidgetItem *QListWidget::itemAt(const QPoint &p) const
{
    Q_D(const QListWidget);
    return d->listModel()->at(indexAt(p).row());

}